

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

string * __thiscall
Catch::ReporterFactory<Catch::JunitReporter>::getDescription_abi_cxx11_
          (ReporterFactory<Catch::JunitReporter> *this)

{
  string *in_RDI;
  
  JunitReporter::getDescription_abi_cxx11_();
  return in_RDI;
}

Assistant:

std::string getDescription() const override {
            return T::getDescription();
        }